

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

size_t __thiscall
MADPComponentDiscreteActions::ConstructJointActionsRecursively
          (MADPComponentDiscreteActions *this,Index curAgentI,JointActionDiscrete *ja,Index jaI)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  JointActionDiscrete *this_00;
  JointActionDiscrete *pJVar4;
  ostream *poVar5;
  undefined8 uVar6;
  stringstream *psVar7;
  size_t sVar8;
  uint in_ECX;
  stringstream *in_RDX;
  uint in_ESI;
  long in_RDI;
  ActionDiscrete *ai;
  JointActionDiscrete *p_ja;
  JointActionDiscrete *p_jaReceivedArgCopy;
  stringstream ss_1;
  iterator beforelast;
  iterator last;
  iterator it;
  iterator first;
  stringstream ss;
  bool lastAgent;
  stringstream *in_stack_fffffffffffffc18;
  E *in_stack_fffffffffffffc20;
  stringstream *__lhs;
  __normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
  *in_stack_fffffffffffffc28;
  vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *in_stack_fffffffffffffc30;
  JointActionDiscrete *in_stack_fffffffffffffc58;
  stringstream *local_378;
  stringstream local_368 [16];
  ostream local_358 [316];
  Index in_stack_fffffffffffffde4;
  ActionDiscrete *in_stack_fffffffffffffde8;
  JointActionDiscrete *in_stack_fffffffffffffdf0;
  __normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
  local_1c8;
  ActionDiscrete *local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [372];
  Index in_stack_ffffffffffffffdc;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar9;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar9 = (uint)in_stack_ffffffffffffffe0;
  uVar2 = (ulong)in_ESI;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (uVar2 == sVar3 - 1) {
    uVar9 = CONCAT13(1,(int3)uVar9);
  }
  this_00 = (JointActionDiscrete *)(ulong)in_ESI;
  pJVar4 = (JointActionDiscrete *)
           std::
           vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ::size((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                   *)(in_RDI + 0x58));
  if (this_00 < pJVar4) {
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)in_ESI);
    local_1c0 = (ActionDiscrete *)
                std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::begin
                          ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
                           in_stack_fffffffffffffc18);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)in_ESI);
    local_1c8._M_current =
         (ActionDiscrete *)
         std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::begin
                   ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
                    in_stack_fffffffffffffc18);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)in_ESI);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::end
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffc18)
    ;
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)in_ESI);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::end
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffc18)
    ;
    __gnu_cxx::
    __normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
    ::operator--(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                        *)in_stack_fffffffffffffc20,
                       (__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                        *)in_stack_fffffffffffffc18);
    if (bVar1) {
      std::__cxx11::stringstream::stringstream(local_368);
      poVar5 = std::operator<<(local_358,"ERROR empty action set for agent ");
      std::ostream::operator<<(poVar5,in_ESI);
      uVar6 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      __cxa_throw(uVar6,&E::typeinfo,E::~E);
    }
    psVar7 = (stringstream *)operator_new(0x48);
    JointActionDiscrete::JointActionDiscrete(this_00,in_stack_fffffffffffffc58);
    __lhs = psVar7;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                               *)__lhs,(__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                                        *)in_stack_fffffffffffffc18), bVar1) {
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                          *)__lhs,(__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                                   *)in_stack_fffffffffffffc18);
      local_378 = in_RDX;
      if ((!bVar1) &&
         (bVar1 = __gnu_cxx::operator==
                            ((__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                              *)__lhs,(__normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
                                       *)in_stack_fffffffffffffc18), local_378 = psVar7, !bVar1)) {
        in_stack_fffffffffffffc18 = (stringstream *)operator_new(0x48);
        JointActionDiscrete::JointActionDiscrete(this_00,in_stack_fffffffffffffc58);
        local_378 = in_stack_fffffffffffffc18;
      }
      if ((uVar9 & 0x1000000) != 0) {
        DiscreteEntity::SetIndex((DiscreteEntity *)(local_378 + 8),in_ECX);
      }
      __gnu_cxx::
      __normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
      ::operator*(&local_1c8);
      JointActionDiscrete::AddIndividualAction
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      if ((uVar9 & 0x1000000) == 0) {
        sVar8 = ConstructJointActionsRecursively
                          ((MADPComponentDiscreteActions *)
                           CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_RDX >> 0x20)
                           ,(JointActionDiscrete *)CONCAT44(in_ECX,uVar9),in_stack_ffffffffffffffdc)
        ;
        in_ECX = (uint)sVar8;
      }
      else {
        std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::push_back
                  (in_stack_fffffffffffffc30,(value_type *)in_stack_fffffffffffffc28);
        in_ECX = in_ECX + 1;
      }
      __gnu_cxx::
      __normal_iterator<ActionDiscrete_*,_std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>
      ::operator++(in_stack_fffffffffffffc28,(int)((ulong)__lhs >> 0x20));
    }
    return (ulong)in_ECX;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar5 = std::operator<<(local_198,"ConstructJointActionsRecursively - current Agent index (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_ESI);
  poVar5 = std::operator<<(poVar5,") out of bounds! (_m_actionVecs contains actions for ");
  sVar3 = std::
          vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
          ::size((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
  std::operator<<(poVar5," agents...)\n");
  uVar6 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  __cxa_throw(uVar6,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::ConstructJointActionsRecursively(
    Index curAgentI, JointActionDiscrete& ja, Index jaI)
{

    bool lastAgent=false;
    if(curAgentI == _m_nrActions.size()-1)
    {
        lastAgent = true;    
    }
    if(curAgentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "ConstructJointActionsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }

    ActionDVec::iterator first = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator it = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator last = _m_actionVecs[curAgentI].end();
    ActionDVec::iterator beforelast = _m_actionVecs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss; ss << "ERROR empty action set for agent " << curAgentI;
        throw E(ss);
    }
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
        
    while( it != last) // other actions extend duplicates of ja
    {
        if(DEBUG_CJA)    cerr << "\nnext action";
            if(it == first) //
            {
                if(DEBUG_CJA)        
                    cerr << "(first action - not making copy)\n";
                p_ja = &ja;
            }
        else if (it == beforelast)//this is the last valid it -> last action   
        {
            if(DEBUG_CJA)        cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "
                << jaI <<endl;
        }
        ActionDiscrete* ai = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)cerr <<"Adding agent's indiv. action to joint action..."
            <<endl;
        p_ja->AddIndividualAction(ai, curAgentI);
        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = ConstructJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
        it++;
    }
    if(DEBUG_CJA)    
        cerr << ">>ProblemDecTiger::ConstructJointActionsRecursively(Index "<<
            curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"
            <<endl;
    return jaI;
}